

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ph.h
# Opt level: O2

edata_t * duckdb_je_edata_avail_first(edata_avail_t *ph)

{
  edata_t *peVar1;
  edata_t *peVar2;
  uintptr_t a_eaddr;
  edata_t *peVar3;
  edata_t *peVar4;
  uintptr_t b_eaddr;
  edata_t *peVar5;
  uintptr_t a_eaddr_1;
  ulong uVar6;
  edata_t *peVar7;
  ulong uVar8;
  edata_t *peVar9;
  uintptr_t b_eaddr_1;
  
  peVar1 = (edata_t *)(ph->ph).root;
  if (peVar1 != (edata_t *)0x0) {
    (ph->ph).auxcount = 0;
    peVar5 = (peVar1->field_5).ql_link_active.qre_prev;
    if (peVar5 != (edata_t *)0x0) {
      (peVar1->field_5).ql_link_active.qre_next = (edata_t *)0x0;
      (peVar1->field_5).ql_link_active.qre_prev = (edata_t *)0x0;
      (peVar5->field_5).ql_link_active.qre_next = (edata_t *)0x0;
      peVar3 = (peVar5->field_5).ql_link_active.qre_prev;
      peVar4 = peVar5;
      if (peVar3 != (edata_t *)0x0) {
        peVar4 = (peVar3->field_5).ql_link_active.qre_prev;
        if (peVar4 != (edata_t *)0x0) {
          (peVar4->field_5).ql_link_active.qre_next = (edata_t *)0x0;
        }
        (peVar5->field_5).ql_link_active.qre_next = (edata_t *)0x0;
        (peVar5->field_5).ql_link_active.qre_prev = (edata_t *)0x0;
        (peVar3->field_5).ql_link_active.qre_next = (edata_t *)0x0;
        (peVar3->field_5).ql_link_active.qre_prev = (edata_t *)0x0;
        uVar8 = (peVar5->field_2).e_size_esn & 0xfff;
        uVar6 = (peVar3->field_2).e_size_esn & 0xfff;
        if ((int)(((uint)(uVar6 < uVar8) - (uint)(uVar8 < uVar6)) * 2 - (uint)(peVar5 < peVar3)) < 0
           ) {
          (peVar3->field_5).ql_link_active.qre_next = peVar5;
          peVar7 = *(edata_t **)((long)&peVar5->field_5 + 0x10);
          (peVar3->field_5).ql_link_active.qre_prev = peVar7;
          if (peVar7 != (edata_t *)0x0) {
            (peVar7->field_5).ql_link_active.qre_next = peVar3;
          }
          *(edata_t **)((long)&peVar5->field_5 + 0x10) = peVar3;
          peVar3 = peVar5;
        }
        else {
          (peVar5->field_5).ql_link_active.qre_next = peVar3;
          peVar7 = *(edata_t **)((long)&peVar3->field_5 + 0x10);
          (peVar5->field_5).ql_link_active.qre_prev = peVar7;
          if (peVar7 != (edata_t *)0x0) {
            (peVar7->field_5).ql_link_active.qre_next = peVar5;
          }
          *(edata_t **)((long)&peVar3->field_5 + 0x10) = peVar5;
          peVar5 = peVar3;
        }
        while (peVar4 != (edata_t *)0x0) {
          peVar7 = (peVar4->field_5).ql_link_active.qre_prev;
          if (peVar7 == (edata_t *)0x0) {
            peVar9 = (edata_t *)0x0;
          }
          else {
            peVar9 = (peVar7->field_5).ql_link_active.qre_prev;
            if (peVar9 != (edata_t *)0x0) {
              (peVar9->field_5).ql_link_active.qre_next = (edata_t *)0x0;
            }
            (peVar4->field_5).ql_link_active.qre_next = (edata_t *)0x0;
            (peVar4->field_5).ql_link_active.qre_prev = (edata_t *)0x0;
            (peVar7->field_5).ql_link_active.qre_next = (edata_t *)0x0;
            (peVar7->field_5).ql_link_active.qre_prev = (edata_t *)0x0;
            uVar6 = (peVar4->field_2).e_size_esn & 0xfff;
            uVar8 = (peVar7->field_2).e_size_esn & 0xfff;
            if ((int)(((uint)(uVar8 < uVar6) - (uint)(uVar6 < uVar8)) * 2 - (uint)(peVar4 < peVar7))
                < 0) {
              (peVar7->field_5).ql_link_active.qre_next = peVar4;
              peVar2 = *(edata_t **)((long)&peVar4->field_5 + 0x10);
              (peVar7->field_5).ql_link_active.qre_prev = peVar2;
              if (peVar2 != (edata_t *)0x0) {
                (peVar2->field_5).ql_link_active.qre_next = peVar7;
              }
              *(edata_t **)((long)&peVar4->field_5 + 0x10) = peVar7;
            }
            else {
              (peVar4->field_5).ql_link_active.qre_next = peVar7;
              peVar2 = *(edata_t **)((long)&peVar7->field_5 + 0x10);
              (peVar4->field_5).ql_link_active.qre_prev = peVar2;
              if (peVar2 != (edata_t *)0x0) {
                (peVar2->field_5).ql_link_active.qre_next = peVar4;
              }
              *(edata_t **)((long)&peVar7->field_5 + 0x10) = peVar4;
              peVar4 = peVar7;
            }
          }
          (peVar5->field_5).ql_link_active.qre_prev = peVar4;
          peVar5 = peVar4;
          peVar4 = peVar9;
        }
        peVar7 = (peVar3->field_5).ql_link_active.qre_prev;
        peVar4 = peVar3;
        if (peVar7 != (edata_t *)0x0) {
          while( true ) {
            peVar9 = (peVar7->field_5).ql_link_active.qre_prev;
            (peVar3->field_5).ql_link_active.qre_prev = (edata_t *)0x0;
            (peVar7->field_5).ql_link_active.qre_prev = (edata_t *)0x0;
            uVar6 = (peVar3->field_2).e_size_esn & 0xfff;
            uVar8 = (peVar7->field_2).e_size_esn & 0xfff;
            if ((int)(((uint)(uVar8 < uVar6) - (uint)(uVar6 < uVar8)) * 2 - (uint)(peVar3 < peVar7))
                < 0) {
              (peVar7->field_5).ql_link_active.qre_next = peVar3;
              peVar4 = *(edata_t **)((long)&peVar3->field_5 + 0x10);
              (peVar7->field_5).ql_link_active.qre_prev = peVar4;
              if (peVar4 != (edata_t *)0x0) {
                (peVar4->field_5).ql_link_active.qre_next = peVar7;
              }
              *(edata_t **)((long)&peVar3->field_5 + 0x10) = peVar7;
              peVar4 = peVar3;
            }
            else {
              (peVar3->field_5).ql_link_active.qre_next = peVar7;
              peVar4 = *(edata_t **)((long)&peVar7->field_5 + 0x10);
              (peVar3->field_5).ql_link_active.qre_prev = peVar4;
              if (peVar4 != (edata_t *)0x0) {
                (peVar4->field_5).ql_link_active.qre_next = peVar3;
              }
              *(edata_t **)((long)&peVar7->field_5 + 0x10) = peVar3;
              peVar4 = peVar7;
            }
            if (peVar9 == (edata_t *)0x0) break;
            (peVar5->field_5).ql_link_active.qre_prev = peVar4;
            peVar7 = (peVar9->field_5).ql_link_active.qre_prev;
            peVar3 = peVar9;
            peVar5 = peVar4;
          }
        }
      }
      (peVar4->field_5).ql_link_active.qre_next = peVar1;
      peVar5 = *(edata_t **)((long)&peVar1->field_5 + 0x10);
      (peVar4->field_5).ql_link_active.qre_prev = peVar5;
      if (peVar5 != (edata_t *)0x0) {
        (peVar5->field_5).ql_link_active.qre_next = peVar4;
      }
      *(edata_t **)((long)&peVar1->field_5 + 0x10) = peVar4;
    }
  }
  return peVar1;
}

Assistant:

JEMALLOC_ALWAYS_INLINE void *
ph_first(ph_t *ph, size_t offset, ph_cmp_t cmp) {
	if (ph->root == NULL) {
		return NULL;
	}
	ph_merge_aux(ph, offset, cmp);
	return ph->root;
}